

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MinimizeRecGroups.cpp
# Opt level: O1

void __thiscall wasm::anon_unknown_0::GroupClassInfo::advanceBrand(GroupClassInfo *this)

{
  optional<wasm::(anonymous_namespace)::BrandTypeIterator> *this_00;
  bool bVar1;
  pointer pvVar2;
  pointer puVar3;
  pointer pSVar4;
  bool bVar5;
  ulong uVar6;
  uint *edge;
  ulong uVar7;
  pointer puVar8;
  initializer_list<wasm::HeapType> __l;
  initializer_list<wasm::HeapType> __l_00;
  HeapType local_80;
  RecGroupShape local_78;
  _Storage<wasm::HeapType,_true> local_70;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> local_68;
  RecGroupShape local_50;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> local_48;
  allocator_type local_2a;
  allocator_type local_29;
  
  this_00 = &this->brand;
  if ((this->brand).
      super__Optional_base<wasm::(anonymous_namespace)::BrandTypeIterator,_false,_false>._M_payload.
      super__Optional_payload<wasm::(anonymous_namespace)::BrandTypeIterator,_true,_false,_false>.
      super__Optional_payload_base<wasm::(anonymous_namespace)::BrandTypeIterator>._M_engaged ==
      true) {
    BrandTypeIterator::operator++((BrandTypeIterator *)this_00);
  }
  else {
    *(pointer *)
     ((long)&(this->brand).
             super__Optional_base<wasm::(anonymous_namespace)::BrandTypeIterator,_false,_false>.
             _M_payload.
             super__Optional_payload<wasm::(anonymous_namespace)::BrandTypeIterator,_true,_false,_false>
             .super__Optional_payload_base<wasm::(anonymous_namespace)::BrandTypeIterator>.
             _M_payload._M_value.fields + 8) = (pointer)0x0;
    *(pointer *)
     ((long)&(this->brand).
             super__Optional_base<wasm::(anonymous_namespace)::BrandTypeIterator,_false,_false>.
             _M_payload.
             super__Optional_payload<wasm::(anonymous_namespace)::BrandTypeIterator,_true,_false,_false>
             .super__Optional_payload_base<wasm::(anonymous_namespace)::BrandTypeIterator>.
             _M_payload._M_value.fields + 0x10) = (pointer)0x0;
    *(undefined8 *)
     &(this_00->super__Optional_base<wasm::(anonymous_namespace)::BrandTypeIterator,_false,_false>).
      _M_payload.
      super__Optional_payload<wasm::(anonymous_namespace)::BrandTypeIterator,_true,_false,_false>.
      super__Optional_payload_base<wasm::(anonymous_namespace)::BrandTypeIterator>._M_payload = 0;
    *(undefined8 *)
     &(this->brand).
      super__Optional_base<wasm::(anonymous_namespace)::BrandTypeIterator,_false,_false>._M_payload.
      super__Optional_payload<wasm::(anonymous_namespace)::BrandTypeIterator,_true,_false,_false>.
      super__Optional_payload_base<wasm::(anonymous_namespace)::BrandTypeIterator>._M_payload.
      _M_value.fields.
      super__Vector_base<wasm::(anonymous_namespace)::BrandTypeIterator::FieldInfo,_std::allocator<wasm::(anonymous_namespace)::BrandTypeIterator::FieldInfo>_>
         = 0;
    (this->brand).super__Optional_base<wasm::(anonymous_namespace)::BrandTypeIterator,_false,_false>
    ._M_payload.
    super__Optional_payload<wasm::(anonymous_namespace)::BrandTypeIterator,_true,_false,_false>.
    super__Optional_payload_base<wasm::(anonymous_namespace)::BrandTypeIterator>._M_engaged = true;
    local_48.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_48.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
    ::_M_range_insert<std::vector<unsigned_int,std::allocator<unsigned_int>>const*>
              ((vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                *)&this->subtypeGraph,
               (this->subtypeGraph).
               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,&local_48);
    if (local_48.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_48.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_48.
                            super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_48.
                            super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    pvVar2 = (this->subtypeGraph).
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar6 = ((long)(this->subtypeGraph).
                   super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar2 >> 3) *
            -0x5555555555555555;
    if (1 < uVar6) {
      uVar7 = 1;
      do {
        puVar3 = *(pointer *)
                  ((long)&pvVar2[uVar7].
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data + 8);
        for (puVar8 = pvVar2[uVar7].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start; puVar8 != puVar3;
            puVar8 = puVar8 + 1) {
          *puVar8 = *puVar8 + 1;
        }
        uVar7 = (ulong)((int)uVar7 + 1);
      } while (uVar7 <= uVar6 && uVar6 - uVar7 != 0);
    }
  }
  bVar1 = (this->singletonType).super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::HeapType>._M_engaged;
  if (bVar1 == true) {
    local_80 = BrandTypeIterator::operator*((BrandTypeIterator *)this_00);
    __l._M_len = 1;
    __l._M_array = &local_80;
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::vector(&local_48,__l,&local_2a);
    local_70 = (this->singletonType).super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
               super__Optional_payload_base<wasm::HeapType>._M_payload;
    __l_00._M_len = 1;
    __l_00._M_array = (iterator)&local_70;
    local_50.types = &local_48;
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::vector(&local_68,__l_00,&local_29)
    ;
    local_78.types = &local_68;
    bVar5 = RecGroupShape::operator==(&local_50,&local_78);
  }
  else {
    bVar5 = false;
  }
  if ((bVar1 != false) &&
     (local_68.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0)) {
    operator_delete(local_68.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_68.
                          super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.
                          super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if ((bVar1 != false) &&
     (local_48.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0)) {
    operator_delete(local_48.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.
                          super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.
                          super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (bVar5 != false) {
    BrandTypeIterator::operator++((BrandTypeIterator *)this_00);
  }
  pSVar4 = (this->orders).selectors.
           super__Vector_base<wasm::TopologicalOrdersImpl<std::monostate>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<std::monostate>::Selector>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pSVar4 != (pointer)0x0) {
    operator_delete(pSVar4,(long)(this->orders).selectors.
                                 super__Vector_base<wasm::TopologicalOrdersImpl<std::monostate>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<std::monostate>::Selector>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pSVar4);
  }
  puVar8 = (this->orders).choiceHeap.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (puVar8 != (pointer)0x0) {
    operator_delete(puVar8,(long)(this->orders).choiceHeap.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar8);
  }
  puVar8 = (this->orders).buf.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (puVar8 != (pointer)0x0) {
    operator_delete(puVar8,(long)(this->orders).buf.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar8);
  }
  puVar8 = (this->orders).indegrees.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (puVar8 != (pointer)0x0) {
    operator_delete(puVar8,(long)(this->orders).indegrees.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar8);
  }
  TopologicalOrdersImpl<std::monostate>::TopologicalOrdersImpl(&this->orders,&this->subtypeGraph);
  return;
}

Assistant:

void advanceBrand() {
    if (brand) {
      ++*brand;
    } else {
      brand.emplace();
      // Make room in the subtype graph for the brand type, which goes at the
      // beginning of the canonical order.
      subtypeGraph.insert(subtypeGraph.begin(), {{}});
      // Adjust indices.
      for (Index i = 1; i < subtypeGraph.size(); ++i) {
        for (auto& edge : subtypeGraph[i]) {
          ++edge;
        }
      }
    }
    // Make sure the brand is not the same as the real type.
    if (singletonType &&
        RecGroupShape({**brand}) == RecGroupShape({*singletonType})) {
      ++*brand;
    }
    // Start back at the initial permutation with the new brand.
    orders.~TopologicalOrders();
    new (&orders) TopologicalOrders(subtypeGraph);
  }